

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::FileIsDirectory(string *inName)

{
  int iVar1;
  ulong uVar2;
  char *__file;
  bool local_10f1;
  undefined1 local_10e0 [8];
  stat fs;
  char *name;
  string string_buffer;
  char local_buffer [4096];
  string *inName_local;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)&name);
    __file = RemoveTrailingSlashes
                       (inName,(char (*) [4096])((long)&string_buffer.field_2 + 8),(string *)&name);
    iVar1 = stat(__file,(stat *)local_10e0);
    local_10f1 = iVar1 == 0 && ((uint)fs.st_nlink & 0xf000) == 0x4000;
    inName_local._7_1_ = local_10f1;
    std::__cxx11::string::~string((string *)&name);
  }
  else {
    inName_local._7_1_ = false;
  }
  return inName_local._7_1_;
}

Assistant:

bool SystemTools::FileIsDirectory(const std::string& inName)
{
  if (inName.empty()) {
    return false;
  }

  char local_buffer[KWSYS_SYSTEMTOOLS_MAXPATH];
  std::string string_buffer;
  const auto name = RemoveTrailingSlashes(inName, local_buffer, string_buffer);

// Now check the file node type.
#if defined(_WIN32)
  DWORD attr =
    GetFileAttributesW(Encoding::ToWindowsExtendedPath(name).c_str());
  return (attr != INVALID_FILE_ATTRIBUTES) &&
    (attr & FILE_ATTRIBUTE_DIRECTORY);
#else
  struct stat fs;

  return (stat(name, &fs) == 0) && S_ISDIR(fs.st_mode);
#endif
}